

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# language.c
# Opt level: O3

languageDefinition * prvTidytidyTestLanguage(ctmbstr languageCode)

{
  int iVar1;
  languageDefinition *plVar2;
  ulong uVar3;
  
  if (PTR_language_en_001cd210 != (undefined *)0x0) {
    uVar3 = 1;
    plVar2 = (languageDefinition *)PTR_language_en_001cd210;
    do {
      iVar1 = strcmp(plVar2->messages[0].value,languageCode);
      if (iVar1 == 0) {
        return plVar2;
      }
      plVar2 = (languageDefinition *)(&PTR_language_en_001cd210)[uVar3];
      uVar3 = (ulong)((int)uVar3 + 1);
    } while (plVar2 != (languageDefinition *)0x0);
  }
  return (languageDefinition *)0x0;
}

Assistant:

languageDefinition *TY_(tidyTestLanguage)( ctmbstr languageCode )
{
    uint i;
    languageDefinition *testLang;
    languageDictionary *testDict;
    ctmbstr testCode;
    
    for (i = 0; tidyLanguages.languages[i]; ++i)
    {
        testLang = tidyLanguages.languages[i];
        testDict = &testLang->messages;
        testCode = (*testDict)[0].value;
        
        if ( strcmp(testCode, languageCode) == 0 )
            return testLang;
    }
    
    return NULL;
}